

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int _w;
  int _h;
  int *piVar1;
  uint uVar2;
  Mat local_78;
  
  _w = this->w;
  _h = this->h;
  if (_h == target_height && _w == target_width) {
    to_pixels(this,pixels,type);
    return;
  }
  uVar2 = type >> 0x10;
  if ((uint)type < 0x10000) {
    uVar2 = type;
  }
  if (uVar2 - 1 < 2) {
    local_78.cstep = 0;
    local_78.data = (uchar *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    create(&local_78,_w,_h,3,3,(Allocator *)0x0);
    to_pixels(this,(uchar *)local_78.data,type);
    resize_bilinear_c3((uchar *)local_78.data,this->w,this->h,this->w * 3,pixels,target_width,
                       target_height,target_stride);
    piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return;
    }
  }
  else if (uVar2 == 3) {
    local_78.cstep = 0;
    local_78.data = (uchar *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    create(&local_78,_w,_h,1,1,(Allocator *)0x0);
    to_pixels(this,(uchar *)local_78.data,type);
    resize_bilinear_c1((uchar *)local_78.data,this->w,this->h,this->w,pixels,target_width,
                       target_height,target_stride);
    piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return;
    }
  }
  else {
    if ((uVar2 & 0xfffffffe) != 4) {
      return;
    }
    local_78.cstep = 0;
    local_78.data = (uchar *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    create(&local_78,_w,_h,4,4,(Allocator *)0x0);
    to_pixels(this,(uchar *)local_78.data,type);
    resize_bilinear_c4((uchar *)local_78.data,this->w,this->h,this->w * 4,pixels,target_width,
                       target_height,target_stride);
    piVar1 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar1 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 != 0) {
      return;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return;
    }
  }
  if ((uchar *)local_78.data != (uchar *)0x0) {
    local_78.allocator = (Allocator *)0x0;
    free(local_78.data);
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA || type_to == PIXEL_BGRA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}